

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O1

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dumpSubgraphEnd
          (DG2Dot<dg::LLVMNode> *this,DependenceGraph<dg::LLVMNode> *sub,bool with_nodes)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Rb_tree_node_base *p_Var3;
  undefined7 in_register_00000011;
  DependenceGraph<dg::LLVMNode> *__range4;
  pair<std::_Rb_tree_iterator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_bool>
  pVar4;
  element_type *local_30;
  
  if ((int)CONCAT71(in_register_00000011,with_nodes) != 0) {
    for (p_Var3 = (sub->nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(sub->nodes)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      dump_node(this,(LLVMNode *)p_Var3[1]._M_parent,2,(char *)0x0);
      dump_node_edges(this,(LLVMNode *)p_Var3[1]._M_parent,2);
    }
    local_30 = (sub->global_nodes).
               super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    p_Var1 = (sub->global_nodes).
             super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
      }
    }
    pVar4 = std::
            _Rb_tree<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::_Identity<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::less<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::allocator<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>>
            ::
            _M_insert_unique<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>
                      ((_Rb_tree<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::_Identity<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::less<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::allocator<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>>
                        *)&this->dumpedGlobals,&local_30);
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      peVar2 = (sub->global_nodes).
               super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var1 = (sub->global_nodes).
               super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
        }
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
      }
      for (p_Var3 = (peVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &(peVar2->_M_t)._M_impl.super__Rb_tree_header;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        dump_node(this,(LLVMNode *)p_Var3[1]._M_parent,2,"GLOB");
        dump_node_edges(this,(LLVMNode *)p_Var3[1]._M_parent,2);
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->out,"\t}\n",3);
  return;
}

Assistant:

void dumpSubgraphEnd(DependenceGraph<NodeT> *sub, bool with_nodes = true) {
        if (with_nodes) {
            // dump all nodes, to get it without BBlocks
            // (we may not have BBlocks or we just don't want
            // to print them
            for (auto &I : *sub) {
                dump_node(I.second, 2);
                dump_node_edges(I.second, 2);
            }

            if (dumpedGlobals.insert(sub->getGlobalNodes().get()).second) {
                for (auto &I : *sub->getGlobalNodes()) {
                    dump_node(I.second, 2, "GLOB");
                    dump_node_edges(I.second, 2);
                }
            }
        }

        out << "\t}\n";
    }